

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzip.c++
# Opt level: O0

Promise<unsigned_long> __thiscall
kj::GzipAsyncInputStream::readImpl
          (GzipAsyncInputStream *this,byte *out,size_t minBytes,size_t maxBytes,size_t alreadyRead)

{
  bool bVar1;
  ulong uVar2;
  byte *in_R9;
  Fault local_c8;
  Fault f_2;
  Fault f_1;
  size_t n;
  Fault f;
  int local_a0;
  DebugExpression<int> local_9c;
  undefined1 local_98 [8];
  DebugComparison<int,_int> _kjCondition;
  int inflateResult;
  byte *local_38;
  size_t alreadyRead_local;
  size_t maxBytes_local;
  size_t minBytes_local;
  byte *out_local;
  GzipAsyncInputStream *this_local;
  
  alreadyRead_local = alreadyRead;
  maxBytes_local = maxBytes;
  minBytes_local = minBytes;
  out_local = out;
  this_local = this;
  if (*(int *)(out + 0x18) == 0) {
    (**(code **)(**(long **)(out + 8) + 8))
              ((Type *)&stack0xffffffffffffffc0,*(long **)(out + 8),out + 0x81,1,0x1000);
    Promise<unsigned_long>::
    then<kj::GzipAsyncInputStream::readImpl(unsigned_char*,unsigned_long,unsigned_long,unsigned_long)::__0>
              ((Promise<unsigned_long> *)this,(Type *)&stack0xffffffffffffffc0);
    Promise<unsigned_long>::~Promise((Promise<unsigned_long> *)&stack0xffffffffffffffc0);
  }
  else {
    *(size_t *)(out + 0x28) = minBytes;
    *(int *)(out + 0x30) = (int)alreadyRead;
    local_38 = in_R9;
    _kjCondition._24_4_ = inflate(out + 0x10,0);
    out[0x80] = _kjCondition._24_4_ == 1;
    if ((_kjCondition._24_4_ != 0) && (_kjCondition._24_4_ != 1)) {
      if (*(long *)(out + 0x40) != 0) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26],char*&>
                  (&local_c8,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/gzip.c++"
                   ,0xed,FAILED,(char *)0x0,"\"gzip decompression failed\", ctx.msg",
                   (char (*) [26])"gzip decompression failed",(char **)(out + 0x40));
        kj::_::Debug::Fault::fatal(&local_c8);
      }
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26],int&>
                (&f_2,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/gzip.c++"
                 ,0xeb,FAILED,(char *)0x0,"\"gzip decompression failed\", inflateResult",
                 (char (*) [26])"gzip decompression failed",(int *)&_kjCondition.result);
      kj::_::Debug::Fault::fatal(&f_2);
    }
    if (((out[0x80] & 1) != 0) && (*(int *)(out + 0x18) != 0)) {
      local_a0 = inflateReset(out + 0x10);
      local_9c = kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_a0);
      f.exception._4_4_ = 0;
      kj::_::DebugExpression<int>::operator==
                ((DebugComparison<int,_int> *)local_98,&local_9c,(int *)((long)&f.exception + 4));
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_98);
      if (!bVar1) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<int,int>&>
                  ((Fault *)&n,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/gzip.c++"
                   ,0xe0,FAILED,"inflateReset(&ctx) == Z_OK","_kjCondition,",
                   (DebugComparison<int,_int> *)local_98);
        kj::_::Debug::Fault::fatal((Fault *)&n);
      }
    }
    uVar2 = alreadyRead_local - *(uint *)(out + 0x30);
    if (uVar2 < maxBytes_local) {
      readImpl(this,out,minBytes_local + uVar2,maxBytes_local - uVar2,alreadyRead_local - uVar2);
    }
    else {
      Promise<unsigned_long>::Promise
                ((Promise<unsigned_long> *)this,(FixVoid<unsigned_long>)(local_38 + uVar2));
    }
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<size_t> GzipAsyncInputStream::readImpl(
    byte* out, size_t minBytes, size_t maxBytes, size_t alreadyRead) {
  if (ctx.avail_in == 0) {
    return inner.tryRead(buffer, 1, sizeof(buffer))
        .then([this,out,minBytes,maxBytes,alreadyRead](size_t amount) -> Promise<size_t> {
      if (amount == 0) {
        if (!atValidEndpoint) {
          return KJ_EXCEPTION(DISCONNECTED, "gzip compressed stream ended prematurely");
        }
        return alreadyRead;
      } else {
        ctx.next_in = buffer;
        ctx.avail_in = amount;
        return readImpl(out, minBytes, maxBytes, alreadyRead);
      }
    });
  }

  ctx.next_out = out;
  ctx.avail_out = maxBytes;

  auto inflateResult = inflate(&ctx, Z_NO_FLUSH);
  atValidEndpoint = inflateResult == Z_STREAM_END;
  if (inflateResult == Z_OK || inflateResult == Z_STREAM_END) {
    if (atValidEndpoint && ctx.avail_in > 0) {
      // There's more data available. Assume start of new content.
      KJ_ASSERT(inflateReset(&ctx) == Z_OK);
    }

    size_t n = maxBytes - ctx.avail_out;
    if (n >= minBytes) {
      return n + alreadyRead;
    } else {
      return readImpl(out + n, minBytes - n, maxBytes - n, alreadyRead + n);
    }
  } else {
    if (ctx.msg == nullptr) {
      KJ_FAIL_REQUIRE("gzip decompression failed", inflateResult);
    } else {
      KJ_FAIL_REQUIRE("gzip decompression failed", ctx.msg);
    }
  }
}